

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvatiming.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  nva_card *pnVar2;
  int iVar3;
  uint32_t cnum_00;
  uint32_t uVar4;
  uint32_t uVar5;
  u64 uVar6;
  char **in_RSI;
  int in_EDI;
  undefined1 auVar7 [16];
  u32 unaff_retaddr;
  char *in_stack_00000008;
  uint32_t t1;
  uint32_t t0;
  int cnum;
  int c;
  u32 pmc_enable;
  nva_card *card;
  uint in_stack_00000034;
  uint in_stack_ffffffffffffffd4;
  uint card_00;
  uint card_01;
  int local_4;
  
  card_00 = 0;
  iVar3 = nva_init();
  if (iVar3 == 0) {
    while (iVar3 = getopt(in_EDI,in_RSI,"c:"), pnVar2 = nva_cards, iVar3 != -1) {
      if (iVar3 == 99) {
        __isoc99_sscanf(_optarg,"%d",&stack0xffffffffffffffdc);
      }
    }
    if ((int)card_00 < nva_cardsnum) {
      card_01 = card_00;
      cnum_00 = nva_rd32(card_00,0x200);
      nva_wr32(card_01,0x200,0xffffffff);
      uVar1 = pnVar2[(int)card_00].chipset;
      uVar6 = crystal_type(card_01);
      auVar7._8_4_ = (int)(uVar6 >> 0x20);
      auVar7._0_8_ = uVar6;
      auVar7._12_4_ = 0x45300000;
      printf("Using card nv%x, crystal frequency = %f MHz\n\n",
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) / 1000000.0,
             (ulong)uVar1);
      time_ptimer(in_stack_00000034);
      printf("\n");
      time_pgraph_dispatch_clock(unaff_retaddr);
      printf("\n");
      if (pnVar2[(int)card_00].card_type == 0xc0) {
        time_pcounter_nvc0(cnum_00);
        printf("\n");
      }
      else if (pnVar2[(int)card_00].chipset < 0x84) {
        if (pnVar2[(int)card_00].chipset < 0x40) {
          if (0xf < pnVar2[(int)card_00].chipset) {
            time_pcounter_nv10(0);
            printf("\n");
          }
        }
        else {
          time_pcounter_nv40(in_stack_ffffffffffffffd4);
          printf("\n");
        }
      }
      else {
        time_pcounter_nv84(in_stack_ffffffffffffffd4);
        printf("\n");
      }
      if (0x4f < pnVar2[(int)card_00].card_type) {
        uVar4 = nva_rd32(card_01,0x610018);
        sleep(1);
        uVar5 = nva_rd32(card_01,0x610018);
        printf("PDISPLAY clock: %d Hz\n",(ulong)(uVar5 - uVar4));
        printf("\n");
      }
      if ((pnVar2[(int)card_00].chipset < 0x98) || (pnVar2[(int)card_00].chipset == 0xa0)) {
        printf("Your card doesn\'t support fuc (chipset > nv98+ && chipset != nva0 needed)\n");
        local_4 = 0;
      }
      else {
        time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
        time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
        printf("\n");
        time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
        time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
        printf("\n");
        time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
        time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
        printf("\n");
        if (((pnVar2[(int)card_00].chipset == 0x98) || (pnVar2[(int)card_00].chipset == 0xaa)) ||
           (pnVar2[(int)card_00].chipset == 0xac)) {
          time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
          time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
          printf("\n");
        }
        else {
          printf("Your card doesn\'t support PCOPY (chipset < nva3 only)\n\n");
        }
        if (((pnVar2[(int)card_00].chipset < 0xa3) || (pnVar2[(int)card_00].chipset == 0xaa)) ||
           (pnVar2[(int)card_00].chipset == 0xac)) {
          printf("Your card doesn\'t support PCOPY[0] (nva3+ only)\n\n");
        }
        else {
          time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
          time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
          printf("\n");
        }
        if ((pnVar2[(int)card_00].chipset < 0xc0) || (0xd8 < pnVar2[(int)card_00].chipset)) {
          printf("Your card doesn\'t support PCOPY[0] (nva3+ only)\n\n");
        }
        else {
          time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
          time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
          printf("\n");
        }
        if (((pnVar2[(int)card_00].chipset < 0xa3) || (pnVar2[(int)card_00].chipset == 0xaa)) ||
           (pnVar2[(int)card_00].chipset == 0xac)) {
          printf("Your card doesn\'t support PDAEMON (nva3+ only)\n\n");
        }
        else {
          time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
          time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
          printf("\n");
        }
        if (pnVar2[(int)card_00].chipset == 0xaf) {
          time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
          time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
          printf("\n");
        }
        else {
          printf("Your card doesn\'t support PUNK1C1 (nvaf only)\n\n");
        }
        if (pnVar2[(int)card_00].chipset == 0xd9) {
          time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
          time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
          printf("\n");
        }
        else {
          printf("Your card doesn\'t support PUNK1C3 (nvd9 only)\n\n");
        }
        if (pnVar2[(int)card_00].chipset == 0xd9) {
          time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
          time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
          printf("\n");
        }
        else {
          printf("Your card doesn\'t support PDISPLAY (nvd9 only)\n\n");
        }
        if (pnVar2[(int)card_00].chipset < 0xc0) {
          printf("Your card doesn\'t support PGRAPH (nvc0+ only)\n\n");
        }
        else {
          time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
          time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
          printf("\n");
          time_fuc_engine_periodic(cnum,in_stack_00000008,unaff_retaddr);
          time_fuc_engine_watchdog(cnum,in_stack_00000008,unaff_retaddr);
          printf("\n");
        }
        nva_wr32(card_01,0x200,cnum_00);
        local_4 = 0;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      local_4 = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
	struct nva_card *card = NULL;
	u32 pmc_enable;
	int c;
	int cnum = 0;

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}

	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	} else
		card = &nva_cards[cnum];

	/* activate all the engines */
	pmc_enable = nva_rd32(cnum, 0x200);
	nva_wr32(cnum, 0x200, 0xffffffff);

	printf("Using card nv%x, crystal frequency = %f MHz\n\n",
	       card->chipset, crystal_type(cnum)/1000000.0);

	time_ptimer(cnum);
	printf("\n");

	time_pgraph_dispatch_clock(cnum);
	printf("\n");

	if (card->card_type == 0xc0) {
		time_pcounter_nvc0(cnum);
		printf("\n");
	} else if (card->chipset >= 0x84){
		time_pcounter_nv84(cnum);
		printf("\n");
	} else if (card->chipset >= 0x40) {
		time_pcounter_nv40(cnum);
		printf("\n");
	} else if (card->chipset >= 0x10) {
		time_pcounter_nv10(cnum);
		printf("\n");
	}

	if (card->card_type >= 0x50) {
		uint32_t t0 = nva_rd32(cnum, 0x610018);
		sleep(1);
		uint32_t t1 = nva_rd32(cnum, 0x610018);
		printf ("PDISPLAY clock: %d Hz\n", t1 - t0);
		printf("\n");
	}

	if (card->chipset < 0x98 || card->chipset == 0xa0) {
		/* restore PMC enable */
//		nva_wr32(cnum, 0x200, pmc_enable);

		printf("Your card doesn't support fuc (chipset > nv98+ && chipset != nva0 needed)\n");
		return 0;
	}

	time_fuc_engine_periodic(cnum, "PBSP", 0x84000);
	time_fuc_engine_watchdog(cnum, "PBSP", 0x84000);
	printf("\n");

	time_fuc_engine_periodic(cnum, "PVP", 0x85000);
	time_fuc_engine_watchdog(cnum, "PVP", 0x85000);
	printf("\n");

	time_fuc_engine_periodic(cnum, "PPPP", 0x86000);
	time_fuc_engine_watchdog(cnum, "PPPP", 0x86000);
	printf("\n");

	if (card->chipset == 0x98 || card->chipset == 0xaa || card->chipset == 0xac) {
		time_fuc_engine_periodic(cnum, "PCRYPT", 0x87000);
		time_fuc_engine_watchdog(cnum, "PCRYPT", 0x87000);
		printf("\n");
	} else {
		printf("Your card doesn't support PCOPY (chipset < nva3 only)\n\n");
	}

	if (card->chipset >= 0xa3 && card->chipset != 0xaa && card->chipset != 0xac) {
		time_fuc_engine_periodic(cnum, "PCOPY[0]", 0x104000);
		time_fuc_engine_watchdog(cnum, "PCOPY[0]", 0x104000);
		printf("\n");
	} else {
		printf("Your card doesn't support PCOPY[0] (nva3+ only)\n\n");
	}

	if (card->chipset >= 0xc0 && card->chipset < 0xd9) {
		time_fuc_engine_periodic(cnum, "PCOPY[1]", 0x105000);
		time_fuc_engine_watchdog(cnum, "PCOPY[1]", 0x105000);
		printf("\n");
	} else {
		printf("Your card doesn't support PCOPY[0] (nva3+ only)\n\n");
	}

	if (card->chipset >= 0xa3 && card->chipset != 0xaa && card->chipset != 0xac) {
		time_fuc_engine_periodic(cnum, "PDAEMON", 0x10a000);
		time_fuc_engine_watchdog(cnum, "PDAEMON", 0x10a000);
		printf("\n");
	} else {
		printf("Your card doesn't support PDAEMON (nva3+ only)\n\n");
	}

	if (card->chipset == 0xaf) {
		time_fuc_engine_periodic(cnum, "PUNK1C1", 0x1c1000);
		time_fuc_engine_watchdog(cnum, "PUNK1C1", 0x1c1000);
		printf("\n");
	} else {
		printf("Your card doesn't support PUNK1C1 (nvaf only)\n\n");
	}

	if (card->chipset == 0xd9) {
		time_fuc_engine_periodic(cnum, "PUNK1C3", 0x1c3000);
		time_fuc_engine_watchdog(cnum, "PUNK1C3", 0x1c3000);
		printf("\n");
	} else {
		printf("Your card doesn't support PUNK1C3 (nvd9 only)\n\n");
	}

	if (card->chipset == 0xd9) {
		time_fuc_engine_periodic(cnum, "PDISPLAY", 0x627000);
		time_fuc_engine_watchdog(cnum, "PDISPLAY", 0x627000);
		printf("\n");
	} else {
		printf("Your card doesn't support PDISPLAY (nvd9 only)\n\n");
	}

	if (card->chipset >= 0xc0) {
		time_fuc_engine_periodic(cnum, "PGRAPH.CTXCTL", 0x409000);
		time_fuc_engine_watchdog(cnum, "PGRAPH.CTXCTL", 0x409000);
		printf("\n");

		time_fuc_engine_periodic(cnum, "PGRAPH.TP[0].CTXCTL", 0x502000);
		time_fuc_engine_watchdog(cnum, "PGRAPH.TP[0].CTXCTL", 0x502000);
		printf("\n");
	} else {
		printf("Your card doesn't support PGRAPH (nvc0+ only)\n\n");
	}

	/* restore PMC enable */
	nva_wr32(cnum, 0x200, pmc_enable);

	return 0;
}